

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O1

int Cudd_NextCube(DdGen *gen,int **cube,double *value)

{
  int iVar1;
  DdManager *pDVar2;
  int *piVar3;
  DdNode **ppDVar4;
  int iVar5;
  DdNode *pDVar6;
  DdNode *pDVar7;
  DdNode *pDVar8;
  DdNode *pDVar9;
  bool bVar10;
  
  iVar5 = (gen->stack).sp;
  if (iVar5 != 1) {
    pDVar2 = gen->manager;
    ppDVar4 = (gen->stack).stack;
    do {
      pDVar6 = (DdNode *)((ulong)ppDVar4[(long)iVar5 + -2] & 0xfffffffffffffffe);
      pDVar7 = (pDVar6->type).kids.T;
      pDVar8 = (DdNode *)((ulong)pDVar7 ^ 1);
      if (ppDVar4[(long)iVar5 + -2] == pDVar6) {
        pDVar8 = pDVar7;
      }
      if (pDVar8 != ppDVar4[(long)iVar5 + -1]) {
        (gen->gen).cubes.cube[pDVar6->index] = 1;
        while( true ) {
          ppDVar4[(long)(gen->stack).sp + -1] = pDVar8;
          while( true ) {
            ppDVar4 = (gen->stack).stack;
            pDVar7 = ppDVar4[(long)(gen->stack).sp + -1];
            pDVar8 = (DdNode *)((ulong)pDVar7 & 0xfffffffffffffffe);
            if ((ulong)pDVar8->index == 0x7fffffff) break;
            (gen->gen).cubes.cube[pDVar8->index] = 0;
            pDVar6 = (pDVar8->type).kids.E;
            pDVar9 = (DdNode *)((ulong)pDVar6 ^ 1);
            if (pDVar7 == pDVar8) {
              pDVar9 = pDVar6;
            }
            iVar5 = (gen->stack).sp;
            ppDVar4[iVar5] = pDVar9;
            (gen->stack).sp = iVar5 + 1;
          }
          if ((pDVar7 != (DdNode *)((ulong)pDVar2->one ^ 1)) && (pDVar7 != pDVar2->background))
          break;
          iVar5 = (gen->stack).sp;
          while( true ) {
            if (iVar5 == 1) {
              gen->status = 0;
              (gen->stack).sp = 0;
              goto LAB_0080b3fd;
            }
            pDVar9 = (DdNode *)((ulong)ppDVar4[(long)iVar5 + -2] & 0xfffffffffffffffe);
            pDVar6 = (pDVar9->type).kids.T;
            pDVar8 = (DdNode *)((ulong)pDVar6 ^ 1);
            if (ppDVar4[(long)iVar5 + -2] == pDVar9) {
              pDVar8 = pDVar6;
            }
            piVar3 = (gen->gen).cubes.cube;
            if (pDVar8 != pDVar7) break;
            piVar3[pDVar9->index] = 2;
            iVar1 = (gen->stack).sp;
            iVar5 = iVar1 + -1;
            (gen->stack).sp = iVar5;
            pDVar7 = ppDVar4[(long)iVar1 + -2];
          }
          piVar3[pDVar9->index] = 1;
        }
        gen->status = 1;
        (gen->gen).cubes.value = (pDVar7->type).value;
        goto LAB_0080b3fd;
      }
      (gen->gen).cubes.cube[pDVar6->index] = 2;
      iVar5 = (gen->stack).sp + -1;
      (gen->stack).sp = iVar5;
    } while (iVar5 != 1);
  }
  gen->status = 0;
  (gen->stack).sp = iVar5 + -1;
LAB_0080b3fd:
  bVar10 = gen->status != 0;
  if (bVar10) {
    *cube = (gen->gen).cubes.cube;
    *value = (gen->gen).cubes.value;
  }
  return (uint)bVar10;
}

Assistant:

int
Cudd_NextCube(
  DdGen * gen,
  int ** cube,
  CUDD_VALUE_TYPE * value)
{
    DdNode *top, *treg, *next, *nreg, *prev, *preg;
    DdManager *dd = gen->manager;

    /* Backtrack from previously reached terminal node. */
    while (1) {
        if (gen->stack.sp == 1) {
            /* The current node has no predecessor. */
            gen->status = CUDD_GEN_EMPTY;
            gen->stack.sp--;
            goto done;
        }
        top = gen->stack.stack[gen->stack.sp-1];
        treg = Cudd_Regular(top);
        prev = gen->stack.stack[gen->stack.sp-2];
        preg = Cudd_Regular(prev);
        nreg = cuddT(preg);
        if (prev != preg) {next = Cudd_Not(nreg);} else {next = nreg;}
        if (next != top) { /* follow the then branch next */
            gen->gen.cubes.cube[preg->index] = 1;
            gen->stack.stack[gen->stack.sp-1] = next;
            break;
        }
        /* Pop the stack and try again. */
        gen->gen.cubes.cube[preg->index] = 2;
        gen->stack.sp--;
    }

    while (1) {
        top = gen->stack.stack[gen->stack.sp-1];
        treg = Cudd_Regular(top);
        if (!cuddIsConstant(treg)) {
            /* Take the else branch first. */
            gen->gen.cubes.cube[treg->index] = 0;
            next = cuddE(treg);
            if (top != treg) next = Cudd_Not(next);
            gen->stack.stack[gen->stack.sp] = next; gen->stack.sp++;
        } else if (top == Cudd_Not(DD_ONE(dd)) || top == dd->background) {
            /* Backtrack */
            while (1) {
                if (gen->stack.sp == 1) {
                    /* The current node has no predecessor. */
                    gen->status = CUDD_GEN_EMPTY;
                    gen->stack.sp--;
                    goto done;
                }
                prev = gen->stack.stack[gen->stack.sp-2];
                preg = Cudd_Regular(prev);
                nreg = cuddT(preg);
                if (prev != preg) {next = Cudd_Not(nreg);} else {next = nreg;}
                if (next != top) { /* follow the then branch next */
                    gen->gen.cubes.cube[preg->index] = 1;
                    gen->stack.stack[gen->stack.sp-1] = next;
                    break;
                }
                /* Pop the stack and try again. */
                gen->gen.cubes.cube[preg->index] = 2;
                gen->stack.sp--;
                top = gen->stack.stack[gen->stack.sp-1];
                treg = Cudd_Regular(top);
            }
        } else {
            gen->status = CUDD_GEN_NONEMPTY;
            gen->gen.cubes.value = cuddV(top);
            goto done;
        }
    }

done:
    if (gen->status == CUDD_GEN_EMPTY) return(0);
    *cube = gen->gen.cubes.cube;
    *value = gen->gen.cubes.value;
    return(1);

}